

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
FBX::Decoder::decompress<char>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Decoder *this,
          Span<char> *source)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  runtime_error *this_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<char,_std::allocator<char>_> out;
  char *local_a0;
  undefined4 local_98;
  pointer local_88;
  int local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::vector(&out,1000000,(allocator_type *)&local_a0);
  local_98 = 0;
  local_a0 = (char *)0x0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  iVar3 = inflateInit_(&local_a0,"1.2.11",0x70);
  if (iVar3 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Failed to initialize inflate");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = 0;
  do {
    uVar4 = (long)source->end - (long)source->begin;
    uVar6 = uVar4 - lVar5;
    if (lVar5 + 1000000U <= uVar4) {
      uVar6 = 1000000;
    }
    local_98 = (undefined4)uVar6;
    local_a0 = source->begin + lVar5;
    lVar5 = lVar5 + uVar6;
    do {
      local_80 = 1000000;
      local_88 = out.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      iVar3 = inflate(&local_a0,0);
      uVar4 = (ulong)(1000000 - local_80);
      if (uVar4 < uVar6) {
        __assert_fail("toConsume <= have",
                      "/workspace/llm4binary/github/license_c_cmakelists/WinteryFox[P]FBXImport/importer/src/Decoder.cpp"
                      ,99,
                      "std::vector<T> FBX::Decoder::decompress(const Span<char> &) const [T = char]"
                     );
      }
      pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar2 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,_std::allocator<char>_>::resize
                (__return_storage_ptr__,(size_type)(pcVar1 + (uVar4 - (long)pcVar2)));
      memcpy(pcVar1 + ((long)(__return_storage_ptr__->
                             super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start - (long)pcVar2),
             out.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,uVar4);
    } while (local_80 == 0);
  } while (iVar3 != 1);
  inflateEnd(&local_a0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&out.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::decompress(const Span<char> &source) const {
        std::vector<T> buffer;
        std::vector<char> out(FBX_CHUNK);

        z_stream infstream;
        infstream.zalloc = Z_NULL;
        infstream.zfree = Z_NULL;
        infstream.opaque = Z_NULL;
        infstream.avail_in = 0;
        infstream.next_in = Z_NULL;

        if (inflateInit(&infstream) != Z_OK) {
            throw std::runtime_error("Failed to initialize inflate");
        }

        int ret;
        size_t consumed = 0;
        do {
            size_t toConsume;
            if (consumed + FBX_CHUNK > source.size())
                toConsume = source.size() - consumed;
            else
                toConsume = FBX_CHUNK;

            infstream.avail_in = toConsume;
            infstream.next_in = (Bytef *) source.begin + consumed;
            consumed += toConsume;

            do {
                infstream.avail_out = FBX_CHUNK;
                infstream.next_out = (Bytef *) out.data();

                ret = inflate(&infstream, Z_NO_FLUSH);

                size_t have = FBX_CHUNK - infstream.avail_out;
                size_t size = buffer.size() * sizeof(T);

                assert(toConsume <= have); // TODO: Fix buffer overflow for large chunks to inflate

                buffer.resize(buffer.size() + have / sizeof(T));
                std::memcpy(buffer.data() + size, out.data(), have);
            } while (infstream.avail_out == 0);
        } while (ret != Z_STREAM_END);
        inflateEnd(&infstream);
        return buffer;
    }